

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O3

ssize_t __thiscall crnlib::cfile_stream::write(cfile_stream *this,int __fd,void *__buf,size_t __n)

{
  undefined1 *puVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  
  uVar3 = 0;
  if (((((this->super_data_stream).field_0x1a & 1) != 0) && ((int)__buf != 0)) &&
     (((this->super_data_stream).m_attribs & 2) != 0)) {
    uVar3 = (ulong)__buf & 0xffffffff;
    sVar2 = fwrite((void *)CONCAT44(in_register_00000034,__fd),1,uVar3,(FILE *)this->m_pFile);
    if (sVar2 == uVar3) {
      uVar3 = uVar3 + this->m_ofs;
      this->m_ofs = uVar3;
      if (uVar3 < this->m_size) {
        uVar3 = this->m_size;
      }
      this->m_size = uVar3;
      uVar3 = (ulong)__buf & 0xffffffff;
    }
    else {
      puVar1 = &(this->super_data_stream).field_0x1a;
      *puVar1 = *puVar1 | 2;
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

virtual uint write(const void* pBuf, uint len) {
    CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

    if (!m_opened || (!is_writable()) || (!len))
      return 0;

    if (fwrite(pBuf, 1, len, m_pFile) != len) {
      set_error();
      return 0;
    }

    m_ofs += len;
    m_size = math::maximum(m_size, m_ofs);

    return len;
  }